

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall sf2cute::SoundFont::RepairReferences(SoundFont *this,SoundFont *origin)

{
  bool bVar1;
  const_iterator __first1;
  const_iterator __last1;
  iterator __first2;
  iterator __i;
  const_iterator __first1_00;
  const_iterator __last1_00;
  iterator __first2_00;
  iterator __i_00;
  __shared_ptr_access<sf2cute::SFPreset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *preset_00;
  __shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *instrument_00;
  __shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  element_type *sample_00;
  insert_iterator<std::unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>_>
  iVar2;
  insert_iterator<std::unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>_>
  __result;
  shared_ptr<sf2cute::SFSample> *sample;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  *__range1_2;
  shared_ptr<sf2cute::SFInstrument> *instrument;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  *__range1_1;
  shared_ptr<sf2cute::SFPreset> *preset;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
  *__range1;
  undefined1 local_d8 [8];
  unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
  sample_map;
  undefined1 local_50 [8];
  unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
  instrument_map;
  SoundFont *origin_local;
  SoundFont *this_local;
  
  instrument_map._M_h._M_single_bucket = (__node_base_ptr)origin;
  std::
  unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
  ::unordered_map((unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                   *)local_50);
  __first1 = std::
             vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
             ::begin((vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
                      *)(instrument_map._M_h._M_single_bucket + 3));
  __last1 = std::
            vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
            ::end((vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
                   *)(instrument_map._M_h._M_single_bucket + 3));
  __first2 = std::
             vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
             ::begin(&this->instruments_);
  __i = std::
        unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
        ::end((unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
               *)local_50);
  iVar2 = std::
          inserter<std::unordered_map<std::shared_ptr<sf2cute::SFInstrument>,std::shared_ptr<sf2cute::SFInstrument>,std::hash<std::shared_ptr<sf2cute::SFInstrument>>,std::equal_to<std::shared_ptr<sf2cute::SFInstrument>>,std::allocator<std::pair<std::shared_ptr<sf2cute::SFInstrument>const,std::shared_ptr<sf2cute::SFInstrument>>>>>
                    ((unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                      *)local_50,__i);
  iVar2 = std::
          transform<__gnu_cxx::__normal_iterator<std::shared_ptr<sf2cute::SFInstrument>const*,std::vector<std::shared_ptr<sf2cute::SFInstrument>,std::allocator<std::shared_ptr<sf2cute::SFInstrument>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<sf2cute::SFInstrument>*,std::vector<std::shared_ptr<sf2cute::SFInstrument>,std::allocator<std::shared_ptr<sf2cute::SFInstrument>>>>,std::insert_iterator<std::unordered_map<std::shared_ptr<sf2cute::SFInstrument>,std::shared_ptr<sf2cute::SFInstrument>,std::hash<std::shared_ptr<sf2cute::SFInstrument>>,std::equal_to<std::shared_ptr<sf2cute::SFInstrument>>,std::allocator<std::pair<std::shared_ptr<sf2cute::SFInstrument>const,std::shared_ptr<sf2cute::SFInstrument>>>>>,std::pair<std::shared_ptr<sf2cute::SFInstrument>,std::shared_ptr<sf2cute::SFInstrument>>(*)(std::shared_ptr<sf2cute::SFInstrument>const&,std::shared_ptr<sf2cute::SFInstrument>const&)>
                    ((__normal_iterator<const_std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                      )__first1._M_current,
                     (__normal_iterator<const_std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                      )__last1._M_current,
                     (__normal_iterator<std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                      )__first2._M_current,iVar2,
                     std::
                     make_pair<std::shared_ptr<sf2cute::SFInstrument>const&,std::shared_ptr<sf2cute::SFInstrument>const&>
                    );
  sample_map._M_h._M_single_bucket = (__node_base_ptr)iVar2.container;
  std::
  unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
  ::unordered_map((unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
                   *)local_d8);
  __first1_00 = std::
                vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                ::begin((vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                         *)(instrument_map._M_h._M_single_bucket + 6));
  __last1_00 = std::
               vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
               ::end((vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                      *)(instrument_map._M_h._M_single_bucket + 6));
  __first2_00 = std::
                vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                ::begin(&this->samples_);
  __i_00 = std::
           unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
           ::end((unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
                  *)local_d8);
  __result = std::
             inserter<std::unordered_map<std::shared_ptr<sf2cute::SFSample>,std::shared_ptr<sf2cute::SFSample>,std::hash<std::shared_ptr<sf2cute::SFSample>>,std::equal_to<std::shared_ptr<sf2cute::SFSample>>,std::allocator<std::pair<std::shared_ptr<sf2cute::SFSample>const,std::shared_ptr<sf2cute::SFSample>>>>>
                       ((unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
                         *)local_d8,__i_00);
  std::
  transform<__gnu_cxx::__normal_iterator<std::shared_ptr<sf2cute::SFSample>const*,std::vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<sf2cute::SFSample>*,std::vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>>,std::insert_iterator<std::unordered_map<std::shared_ptr<sf2cute::SFSample>,std::shared_ptr<sf2cute::SFSample>,std::hash<std::shared_ptr<sf2cute::SFSample>>,std::equal_to<std::shared_ptr<sf2cute::SFSample>>,std::allocator<std::pair<std::shared_ptr<sf2cute::SFSample>const,std::shared_ptr<sf2cute::SFSample>>>>>,std::pair<std::shared_ptr<sf2cute::SFSample>,std::shared_ptr<sf2cute::SFSample>>(*)(std::shared_ptr<sf2cute::SFSample>const&,std::shared_ptr<sf2cute::SFSample>const&)>
            ((__normal_iterator<const_std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
              )__first1_00._M_current,
             (__normal_iterator<const_std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
              )__last1_00._M_current,
             (__normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
              )__first2_00._M_current,__result,
             std::
             make_pair<std::shared_ptr<sf2cute::SFSample>const&,std::shared_ptr<sf2cute::SFSample>const&>
            );
  __end1 = std::
           vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
           ::begin(&this->presets_);
  preset = (shared_ptr<sf2cute::SFPreset> *)
           std::
           vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
           ::end(&this->presets_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<sf2cute::SFPreset>_*,_std::vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>_>
                                *)&preset);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<sf2cute::SFPreset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<sf2cute::SFPreset>_*,_std::vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>_>
              ::operator*(&__end1);
    preset_00 = std::
                __shared_ptr_access<sf2cute::SFPreset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*(this_00);
    RepairPresetReference
              (preset_00,
               (unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                *)local_50);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<sf2cute::SFPreset>_*,_std::vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
             ::begin(&this->instruments_);
  instrument = (shared_ptr<sf2cute::SFInstrument> *)
               std::
               vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
               ::end(&this->instruments_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                        *)&instrument);
    if (!bVar1) break;
    this_01 = (__shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                 ::operator*(&__end1_1);
    instrument_00 =
         std::__shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*(this_01);
    RepairInstrumentReference
              (instrument_00,
               (unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
                *)local_d8);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::
             vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
             ::begin(&this->samples_);
  sample = (shared_ptr<sf2cute::SFSample> *)
           std::
           vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ::end(&this->samples_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
                        *)&sample);
    if (!bVar1) break;
    this_02 = (__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
              ::operator*(&__end1_2);
    sample_00 = std::
                __shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*(this_02);
    RepairSampleReference
              (sample_00,
               (unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
                *)local_d8);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
    ::operator++(&__end1_2);
  }
  std::
  unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
  ::~unordered_map((unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
                    *)local_d8);
  std::
  unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
  ::~unordered_map((unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                    *)local_50);
  return;
}

Assistant:

void SoundFont::RepairReferences(const SoundFont & origin) {
  // Construct a map from the original instrument to the copied instrument.
  std::unordered_map<std::shared_ptr<SFInstrument>, std::shared_ptr<SFInstrument>> instrument_map;
  std::transform(origin.instruments_.begin(), origin.instruments_.end(), instruments_.begin(),
    std::inserter(instrument_map, instrument_map.end()),
    std::make_pair<const std::shared_ptr<SFInstrument> &, const std::shared_ptr<SFInstrument> &>);

  // Construct a map from the original sample to the copied sample.
  std::unordered_map<std::shared_ptr<SFSample>, std::shared_ptr<SFSample>> sample_map;
  std::transform(origin.samples_.begin(), origin.samples_.end(), samples_.begin(),
    std::inserter(sample_map, sample_map.end()),
    std::make_pair<const std::shared_ptr<SFSample> &, const std::shared_ptr<SFSample> &>);

  // Repair presets.
  for (const auto & preset : presets_) {
    RepairPresetReference(*preset, instrument_map);
  }

  // Repair instruments.
  for (const auto & instrument : instruments_) {
    RepairInstrumentReference(*instrument, sample_map);
  }

  // Repair samples.
  for (const auto & sample : samples_) {
    RepairSampleReference(*sample, sample_map);
  }
}